

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx::LineSegmentsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,PrimRef *prims,BBox1f *time_range,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  float fVar2;
  BBox1f BVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  size_t *psVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  unsigned_long uVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  float fVar24;
  float fVar28;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar29;
  undefined1 extraout_var [56];
  float fVar30;
  float fVar32;
  float fVar33;
  undefined1 auVar31 [16];
  float fVar34;
  float fVar35;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar45;
  float fVar46;
  undefined1 auVar44 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar52;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar53;
  undefined1 auVar54 [64];
  float fVar55;
  float fVar61;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar56;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar57;
  float fVar59;
  float fVar60;
  undefined1 auVar58 [64];
  float fVar62;
  float fVar63;
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  float fVar66;
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar50._0_8_ = Geometry::getTimeRange((Geometry *)this);
  auVar50._8_56_ = extraout_var;
  auVar31._8_8_ = 0;
  auVar31._0_4_ = time_range->lower;
  auVar31._4_4_ = time_range->upper;
  auVar25 = auVar50._0_16_;
  auVar42 = vcmpps_avx(auVar25,auVar31,1);
  auVar8 = vblendps_avx(auVar31,auVar25,2);
  auVar25 = vinsertps_avx(auVar25,auVar31,0x50);
  auVar8 = vblendvps_avx(auVar25,auVar8,auVar42);
  auVar42 = vmovshdup_avx(auVar8);
  fVar62 = auVar42._0_4_;
  if (auVar8._0_4_ <= fVar62) {
    uVar12 = r->_begin;
    uVar19 = r->_end;
    if (uVar12 < uVar19) {
      auVar42._8_4_ = 0xff800000;
      auVar42._0_8_ = 0xff800000ff800000;
      auVar42._12_4_ = 0xff800000;
      auVar67 = ZEXT1664(auVar42);
      auVar25._8_4_ = 0x7f800000;
      auVar25._0_8_ = 0x7f8000007f800000;
      auVar25._12_4_ = 0x7f800000;
      auVar68 = ZEXT1664(auVar25);
      sVar11 = 0;
      auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar64 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
      auVar65 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
      auVar54 = ZEXT1664(auVar25);
      auVar58 = ZEXT1664(auVar42);
      do {
        auVar25 = auVar50._0_16_;
        BVar3 = (this->super_LineSegments).super_Geometry.time_range;
        auVar26._8_8_ = 0;
        auVar26._0_4_ = BVar3.lower;
        auVar26._4_4_ = BVar3.upper;
        auVar42 = vmovshdup_avx(auVar26);
        fVar24 = BVar3.lower;
        fVar28 = auVar42._0_4_ - fVar24;
        uVar4 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                         *(long *)&(this->super_LineSegments).field_0x68 * uVar12);
        uVar15 = (ulong)uVar4;
        uVar16 = (ulong)(uVar4 + 1);
        pBVar5 = (this->super_LineSegments).vertices.items;
        if (uVar16 < (pBVar5->super_RawBufferView).num) {
          fVar1 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
          auVar31 = ZEXT416((uint)(fVar1 * ((fVar62 - fVar24) / fVar28) * 0.99999976));
          auVar31 = vroundss_avx(auVar31,auVar31,10);
          auVar26 = vminss_avx(auVar31,ZEXT416((uint)fVar1));
          fVar66 = auVar8._0_4_ - fVar24;
          auVar31 = ZEXT416((uint)(fVar1 * (fVar66 / fVar28) * 1.0000002));
          auVar31 = vroundss_avx(auVar31,auVar31,9);
          auVar31 = vmaxss_avx(auVar25,auVar31);
          if ((uint)(int)auVar31._0_4_ <= (uint)(int)auVar26._0_4_) {
            uVar20 = (ulong)(int)auVar31._0_4_;
            psVar14 = &pBVar5[uVar20].super_RawBufferView.stride;
            do {
              auVar25 = *(undefined1 (*) [16])
                         (((RawBufferView *)(psVar14 + -2))->ptr_ofs + *psVar14 * uVar15);
              auVar31 = vcmpps_avx(auVar25,auVar64._0_16_,2);
              auVar48 = vcmpps_avx(auVar25,auVar65._0_16_,5);
              auVar31 = vorps_avx(auVar31,auVar48);
              if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar31[0xf] < '\0') goto LAB_0124cef9;
              auVar31 = *(undefined1 (*) [16])
                         (((RawBufferView *)(psVar14 + -2))->ptr_ofs + *psVar14 * uVar16);
              auVar48 = vcmpps_avx(auVar31,auVar64._0_16_,2);
              auVar49 = vcmpps_avx(auVar31,auVar65._0_16_,5);
              auVar48 = vorps_avx(auVar48,auVar49);
              if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar48[0xf] < '\0') {
                auVar50 = ZEXT864(0) << 0x40;
                goto LAB_0124cef9;
              }
              auVar25 = vshufps_avx(auVar25,auVar25,0xff);
              auVar31 = vshufps_avx(auVar31,auVar31,0xff);
              auVar31 = vminss_avx(auVar25,auVar31);
              auVar25 = ZEXT816(0) << 0x20;
              auVar50 = ZEXT864(0) << 0x20;
              if (auVar31._0_4_ < 0.0) goto LAB_0124cef9;
              uVar20 = uVar20 + 1;
              psVar14 = psVar14 + 7;
            } while (uVar20 <= (ulong)(long)(int)auVar26._0_4_);
          }
          fVar63 = auVar42._0_4_ - fVar24;
          fVar66 = fVar66 / fVar63;
          fVar63 = (fVar62 - fVar24) / fVar63;
          fVar28 = fVar1 * fVar66;
          fVar24 = fVar1 * fVar63;
          auVar26 = vroundss_avx(ZEXT416((uint)fVar28),ZEXT416((uint)fVar28),9);
          auVar48 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),10);
          auVar42 = vmaxss_avx(auVar26,auVar25);
          auVar31 = vminss_avx(auVar48,ZEXT416((uint)fVar1));
          fVar29 = auVar31._0_4_;
          iVar17 = (int)auVar26._0_4_;
          if (iVar17 < 0) {
            iVar17 = -1;
          }
          uVar4 = (int)fVar1 + 1U;
          if ((int)auVar48._0_4_ < (int)((int)fVar1 + 1U)) {
            uVar4 = (int)auVar48._0_4_;
          }
          lVar13 = (long)(int)auVar42._0_4_;
          pcVar6 = pBVar5[lVar13].super_RawBufferView.ptr_ofs;
          sVar7 = pBVar5[lVar13].super_RawBufferView.stride;
          lVar22 = sVar7 * uVar15;
          lVar21 = sVar7 * uVar16;
          auVar48 = vminps_avx(*(undefined1 (*) [16])(pcVar6 + lVar22),
                               *(undefined1 (*) [16])(pcVar6 + lVar21));
          auVar31 = vmaxps_avx(*(undefined1 (*) [16])(pcVar6 + lVar22),
                               *(undefined1 (*) [16])(pcVar6 + lVar21));
          fVar2 = (this->super_LineSegments).maxRadiusScale;
          auVar26 = vmaxss_avx(ZEXT416(*(uint *)(pcVar6 + lVar21 + 0xc)),
                               ZEXT416(*(uint *)(pcVar6 + lVar22 + 0xc)));
          auVar26 = ZEXT416((uint)(fVar2 * auVar26._0_4_));
          auVar26 = vshufps_avx(auVar26,auVar26,0);
          auVar49 = vsubps_avx(auVar48,auVar26);
          fVar35 = auVar31._0_4_ + auVar26._0_4_;
          fVar39 = auVar31._4_4_ + auVar26._4_4_;
          fVar40 = auVar31._8_4_ + auVar26._8_4_;
          fVar41 = auVar31._12_4_ + auVar26._12_4_;
          lVar21 = (long)(int)fVar29;
          pcVar6 = pBVar5[lVar21].super_RawBufferView.ptr_ofs;
          sVar7 = pBVar5[lVar21].super_RawBufferView.stride;
          lVar23 = sVar7 * uVar15;
          lVar22 = sVar7 * uVar16;
          auVar48 = vminps_avx(*(undefined1 (*) [16])(pcVar6 + lVar23),
                               *(undefined1 (*) [16])(pcVar6 + lVar22));
          auVar31 = vmaxps_avx(*(undefined1 (*) [16])(pcVar6 + lVar23),
                               *(undefined1 (*) [16])(pcVar6 + lVar22));
          auVar26 = vmaxss_avx(ZEXT416(*(uint *)(pcVar6 + lVar22 + 0xc)),
                               ZEXT416(*(uint *)(pcVar6 + lVar23 + 0xc)));
          auVar26 = ZEXT416((uint)(fVar2 * auVar26._0_4_));
          auVar26 = vshufps_avx(auVar26,auVar26,0);
          auVar48 = vsubps_avx(auVar48,auVar26);
          fVar30 = auVar31._0_4_ + auVar26._0_4_;
          fVar32 = auVar31._4_4_ + auVar26._4_4_;
          fVar33 = auVar31._8_4_ + auVar26._8_4_;
          fVar34 = auVar31._12_4_ + auVar26._12_4_;
          auVar42 = ZEXT416((uint)(fVar28 - auVar42._0_4_));
          fVar55 = auVar48._0_4_;
          fVar59 = auVar48._4_4_;
          fVar60 = auVar48._8_4_;
          fVar61 = auVar48._12_4_;
          fVar45 = auVar49._4_4_;
          fVar46 = auVar49._8_4_;
          fVar47 = auVar49._12_4_;
          fVar28 = auVar49._0_4_;
          if (uVar4 - iVar17 == 1) {
            auVar42 = vmaxss_avx(auVar42,auVar25);
            auVar31 = vshufps_avx(auVar42,auVar42,0);
            auVar42 = ZEXT416((uint)(1.0 - auVar42._0_4_));
            auVar42 = vshufps_avx(auVar42,auVar42,0);
            auVar44._0_4_ = auVar42._0_4_ * fVar28 + fVar55 * auVar31._0_4_;
            auVar44._4_4_ = auVar42._4_4_ * fVar45 + fVar59 * auVar31._4_4_;
            auVar44._8_4_ = auVar42._8_4_ * fVar46 + fVar60 * auVar31._8_4_;
            auVar44._12_4_ = auVar42._12_4_ * fVar47 + fVar61 * auVar31._12_4_;
            auVar27._0_4_ = auVar42._0_4_ * fVar35 + auVar31._0_4_ * fVar30;
            auVar27._4_4_ = auVar42._4_4_ * fVar39 + auVar31._4_4_ * fVar32;
            auVar27._8_4_ = auVar42._8_4_ * fVar40 + auVar31._8_4_ * fVar33;
            auVar27._12_4_ = auVar42._12_4_ * fVar41 + auVar31._12_4_ * fVar34;
            auVar42 = vmaxss_avx(ZEXT416((uint)(fVar29 - fVar24)),auVar25);
            auVar25 = vshufps_avx(auVar42,auVar42,0);
            auVar42 = ZEXT416((uint)(1.0 - auVar42._0_4_));
            auVar42 = vshufps_avx(auVar42,auVar42,0);
            auVar48._0_4_ = auVar25._0_4_ * fVar28 + fVar55 * auVar42._0_4_;
            auVar48._4_4_ = auVar25._4_4_ * fVar45 + fVar59 * auVar42._4_4_;
            auVar48._8_4_ = auVar25._8_4_ * fVar46 + fVar60 * auVar42._8_4_;
            auVar48._12_4_ = auVar25._12_4_ * fVar47 + fVar61 * auVar42._12_4_;
            auVar49._0_4_ = auVar25._0_4_ * fVar35 + auVar42._0_4_ * fVar30;
            auVar49._4_4_ = auVar25._4_4_ * fVar39 + auVar42._4_4_ * fVar32;
            auVar49._8_4_ = auVar25._8_4_ * fVar40 + auVar42._8_4_ * fVar33;
            auVar49._12_4_ = auVar25._12_4_ * fVar41 + auVar42._12_4_ * fVar34;
          }
          else {
            pcVar6 = pBVar5[lVar13 + 1].super_RawBufferView.ptr_ofs;
            sVar7 = pBVar5[lVar13 + 1].super_RawBufferView.stride;
            lVar22 = sVar7 * uVar15;
            lVar13 = sVar7 * uVar16;
            auVar26 = vminps_avx(*(undefined1 (*) [16])(pcVar6 + lVar22),
                                 *(undefined1 (*) [16])(pcVar6 + lVar13));
            auVar31 = vmaxss_avx(ZEXT416(*(uint *)(pcVar6 + lVar13 + 0xc)),
                                 ZEXT416(*(uint *)(pcVar6 + lVar22 + 0xc)));
            auVar25 = vmaxps_avx(*(undefined1 (*) [16])(pcVar6 + lVar22),
                                 *(undefined1 (*) [16])(pcVar6 + lVar13));
            auVar31 = ZEXT416((uint)(fVar2 * auVar31._0_4_));
            auVar49 = vshufps_avx(auVar31,auVar31,0);
            auVar27 = vsubps_avx(auVar26,auVar49);
            pcVar6 = pBVar5[lVar21 + -1].super_RawBufferView.ptr_ofs;
            sVar7 = pBVar5[lVar21 + -1].super_RawBufferView.stride;
            lVar21 = sVar7 * uVar15;
            lVar13 = sVar7 * uVar16;
            auVar48 = vminps_avx(*(undefined1 (*) [16])(pcVar6 + lVar21),
                                 *(undefined1 (*) [16])(pcVar6 + lVar13));
            auVar26 = vmaxss_avx(ZEXT416(*(uint *)(pcVar6 + lVar13 + 0xc)),
                                 ZEXT416(*(uint *)(pcVar6 + lVar21 + 0xc)));
            auVar31 = vmaxps_avx(*(undefined1 (*) [16])(pcVar6 + lVar21),
                                 *(undefined1 (*) [16])(pcVar6 + lVar13));
            auVar26 = ZEXT416((uint)(fVar2 * auVar26._0_4_));
            auVar26 = vshufps_avx(auVar26,auVar26,0);
            auVar36 = vsubps_avx(auVar48,auVar26);
            auVar42 = vmaxss_avx(auVar42,ZEXT816(0) << 0x40);
            auVar48 = vshufps_avx(auVar42,auVar42,0);
            auVar42 = ZEXT416((uint)(1.0 - auVar42._0_4_));
            auVar42 = vshufps_avx(auVar42,auVar42,0);
            auVar44._0_4_ = auVar27._0_4_ * auVar48._0_4_ + auVar42._0_4_ * fVar28;
            auVar44._4_4_ = auVar27._4_4_ * auVar48._4_4_ + auVar42._4_4_ * fVar45;
            auVar44._8_4_ = auVar27._8_4_ * auVar48._8_4_ + auVar42._8_4_ * fVar46;
            auVar44._12_4_ = auVar27._12_4_ * auVar48._12_4_ + auVar42._12_4_ * fVar47;
            auVar27._0_4_ = auVar42._0_4_ * fVar35 + auVar48._0_4_ * (auVar25._0_4_ + auVar49._0_4_)
            ;
            auVar27._4_4_ = auVar42._4_4_ * fVar39 + auVar48._4_4_ * (auVar25._4_4_ + auVar49._4_4_)
            ;
            auVar27._8_4_ = auVar42._8_4_ * fVar40 + auVar48._8_4_ * (auVar25._8_4_ + auVar49._8_4_)
            ;
            auVar27._12_4_ =
                 auVar42._12_4_ * fVar41 + auVar48._12_4_ * (auVar25._12_4_ + auVar49._12_4_);
            auVar42 = vmaxss_avx(ZEXT416((uint)(fVar29 - fVar24)),ZEXT416(0));
            auVar25 = vshufps_avx(auVar42,auVar42,0);
            auVar42 = ZEXT416((uint)(1.0 - auVar42._0_4_));
            auVar42 = vshufps_avx(auVar42,auVar42,0);
            auVar48._0_4_ = fVar55 * auVar42._0_4_ + auVar25._0_4_ * auVar36._0_4_;
            auVar48._4_4_ = fVar59 * auVar42._4_4_ + auVar25._4_4_ * auVar36._4_4_;
            auVar48._8_4_ = fVar60 * auVar42._8_4_ + auVar25._8_4_ * auVar36._8_4_;
            auVar48._12_4_ = fVar61 * auVar42._12_4_ + auVar25._12_4_ * auVar36._12_4_;
            auVar49._0_4_ = auVar42._0_4_ * fVar30 + auVar25._0_4_ * (auVar31._0_4_ + auVar26._0_4_)
            ;
            auVar49._4_4_ = auVar42._4_4_ * fVar32 + auVar25._4_4_ * (auVar31._4_4_ + auVar26._4_4_)
            ;
            auVar49._8_4_ = auVar42._8_4_ * fVar33 + auVar25._8_4_ * (auVar31._8_4_ + auVar26._8_4_)
            ;
            auVar49._12_4_ =
                 auVar42._12_4_ * fVar34 + auVar25._12_4_ * (auVar31._12_4_ + auVar26._12_4_);
            uVar18 = iVar17 + 1;
            if ((int)uVar18 < (int)uVar4) {
              psVar14 = &pBVar5[uVar18].super_RawBufferView.stride;
              do {
                auVar36._0_4_ = ((float)(int)uVar18 / fVar1 - fVar66) / (fVar63 - fVar66);
                auVar36._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar42 = vshufps_avx(auVar36,auVar36,0);
                fVar30 = auVar48._4_4_;
                fVar32 = auVar48._8_4_;
                fVar33 = auVar48._12_4_;
                auVar25 = vshufps_avx(ZEXT416((uint)(1.0 - auVar36._0_4_)),
                                      ZEXT416((uint)(1.0 - auVar36._0_4_)),0);
                fVar45 = auVar44._4_4_;
                fVar46 = auVar44._8_4_;
                fVar47 = auVar44._12_4_;
                auVar51._0_4_ = auVar44._0_4_ * auVar25._0_4_ + auVar48._0_4_ * auVar42._0_4_;
                auVar51._4_4_ = fVar45 * auVar25._4_4_ + fVar30 * auVar42._4_4_;
                auVar51._8_4_ = fVar46 * auVar25._8_4_ + fVar32 * auVar42._8_4_;
                auVar51._12_4_ = fVar47 * auVar25._12_4_ + fVar33 * auVar42._12_4_;
                fVar34 = auVar49._4_4_;
                fVar35 = auVar49._8_4_;
                fVar39 = auVar49._12_4_;
                fVar28 = auVar27._4_4_;
                fVar24 = auVar27._8_4_;
                fVar29 = auVar27._12_4_;
                auVar37._0_4_ = auVar49._0_4_ * auVar42._0_4_ + auVar27._0_4_ * auVar25._0_4_;
                auVar37._4_4_ = fVar34 * auVar42._4_4_ + fVar28 * auVar25._4_4_;
                auVar37._8_4_ = fVar35 * auVar42._8_4_ + fVar24 * auVar25._8_4_;
                auVar37._12_4_ = fVar39 * auVar42._12_4_ + fVar29 * auVar25._12_4_;
                pcVar6 = ((RawBufferView *)(psVar14 + -2))->ptr_ofs;
                lVar21 = *psVar14 * uVar15;
                lVar13 = *psVar14 * uVar16;
                auVar31 = vminps_avx(*(undefined1 (*) [16])(pcVar6 + lVar21),
                                     *(undefined1 (*) [16])(pcVar6 + lVar13));
                auVar25 = vmaxss_avx(ZEXT416(*(uint *)(pcVar6 + lVar13 + 0xc)),
                                     ZEXT416(*(uint *)(pcVar6 + lVar21 + 0xc)));
                auVar42 = vmaxps_avx(*(undefined1 (*) [16])(pcVar6 + lVar21),
                                     *(undefined1 (*) [16])(pcVar6 + lVar13));
                auVar25 = ZEXT416((uint)(fVar2 * auVar25._0_4_));
                auVar25 = vshufps_avx(auVar25,auVar25,0);
                auVar31 = vsubps_avx(auVar31,auVar25);
                auVar31 = vsubps_avx(auVar31,auVar51);
                auVar43._0_4_ = auVar25._0_4_ + auVar42._0_4_;
                auVar43._4_4_ = auVar25._4_4_ + auVar42._4_4_;
                auVar43._8_4_ = auVar25._8_4_ + auVar42._8_4_;
                auVar43._12_4_ = auVar25._12_4_ + auVar42._12_4_;
                auVar42 = vsubps_avx(auVar43,auVar37);
                auVar25 = vminps_avx(auVar31,ZEXT816(0));
                auVar42 = vmaxps_avx(auVar42,ZEXT816(0));
                auVar44._0_4_ = auVar44._0_4_ + auVar25._0_4_;
                auVar44._4_4_ = fVar45 + auVar25._4_4_;
                auVar44._8_4_ = fVar46 + auVar25._8_4_;
                auVar44._12_4_ = fVar47 + auVar25._12_4_;
                auVar48._0_4_ = auVar48._0_4_ + auVar25._0_4_;
                auVar48._4_4_ = fVar30 + auVar25._4_4_;
                auVar48._8_4_ = fVar32 + auVar25._8_4_;
                auVar48._12_4_ = fVar33 + auVar25._12_4_;
                auVar27._0_4_ = auVar27._0_4_ + auVar42._0_4_;
                auVar27._4_4_ = fVar28 + auVar42._4_4_;
                auVar27._8_4_ = fVar24 + auVar42._8_4_;
                auVar27._12_4_ = fVar29 + auVar42._12_4_;
                auVar49._0_4_ = auVar49._0_4_ + auVar42._0_4_;
                auVar49._4_4_ = fVar34 + auVar42._4_4_;
                auVar49._8_4_ = fVar35 + auVar42._8_4_;
                auVar49._12_4_ = fVar39 + auVar42._12_4_;
                uVar18 = uVar18 + 1;
                psVar14 = psVar14 + 7;
              } while (uVar4 != uVar18);
            }
          }
          auVar42 = vmaxps_avx(auVar27,auVar49);
          auVar25 = vminps_avx(auVar44,auVar48);
          aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                  vinsertps_avx(auVar25,ZEXT416(geomID),0x30);
          aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                   vinsertps_avx(auVar42,ZEXT416((uint)uVar12),0x30);
          auVar42 = vminps_avx(auVar68._0_16_,(undefined1  [16])aVar9);
          auVar68 = ZEXT1664(auVar42);
          auVar42 = vmaxps_avx(auVar67._0_16_,(undefined1  [16])aVar10);
          auVar67 = ZEXT1664(auVar42);
          auVar38._0_4_ = aVar9.x + aVar10.x;
          auVar38._4_4_ = aVar9.y + aVar10.y;
          auVar38._8_4_ = aVar9.z + aVar10.z;
          auVar38._12_4_ = aVar9.field_3.w + aVar10.field_3.w;
          auVar42 = vminps_avx(auVar54._0_16_,auVar38);
          auVar54 = ZEXT1664(auVar42);
          auVar42 = vmaxps_avx(auVar58._0_16_,auVar38);
          auVar58 = ZEXT1664(auVar42);
          sVar11 = sVar11 + 1;
          prims[k].lower.field_0.field_1 = aVar9;
          prims[k].upper.field_0.field_1 = aVar10;
          uVar19 = r->_end;
          auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar64 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar65 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          k = k + 1;
        }
LAB_0124cef9:
        aVar56 = auVar58._0_16_;
        aVar52 = auVar54._0_16_;
        aVar57 = auVar67._0_16_;
        aVar53 = auVar68._0_16_;
        uVar12 = uVar12 + 1;
      } while (uVar12 < uVar19);
    }
    else {
      sVar11 = 0;
      aVar57.m128[2] = -INFINITY;
      aVar57._0_8_ = 0xff800000ff800000;
      aVar57.m128[3] = -INFINITY;
      aVar53.m128[2] = INFINITY;
      aVar53._0_8_ = 0x7f8000007f800000;
      aVar53.m128[3] = INFINITY;
      aVar52 = aVar53;
      aVar56 = aVar57;
    }
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = aVar53;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = aVar57;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = aVar52;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = aVar56;
    __return_storage_ptr__->end = sVar11;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(getTimeRange(), time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j = r.begin(); j < r.end(); j++) {
          LBBox3fa lbounds = empty;
          if (!linearBounds(j, t0t1, lbounds))
            continue;
          const PrimRef prim(lbounds.bounds(), geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }